

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

void wallet::SetPragma(sqlite3 *db,string *key,string *value,string *err_msg)

{
  int iVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char **args_1;
  long in_FS_OFFSET;
  string stmt_text;
  undefined1 local_70 [8];
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_48,(tinyformat *)"PRAGMA %s = %s",(char *)key,value,in_R8);
  args_1 = (char **)0x0;
  iVar1 = sqlite3_exec(db,local_48._M_dataplus._M_p,0,0);
  if (iVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70 = (undefined1  [8])sqlite3_errstr(iVar1);
    tinyformat::format<std::__cxx11::string,char_const*>
              ((string *)(local_70 + 8),(tinyformat *)"SQLiteDatabase: %s: %s\n",(char *)err_msg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,args_1)
    ;
    std::runtime_error::runtime_error(this,(string *)(local_70 + 8));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static void SetPragma(sqlite3* db, const std::string& key, const std::string& value, const std::string& err_msg)
{
    std::string stmt_text = strprintf("PRAGMA %s = %s", key, value);
    int ret = sqlite3_exec(db, stmt_text.c_str(), nullptr, nullptr, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: %s: %s\n", err_msg, sqlite3_errstr(ret)));
    }
}